

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackTests.cpp
# Opt level: O0

void __thiscall
gl3cts::TransformFeedback::CaptureSpecialInterleaved::prepareAndBind
          (CaptureSpecialInterleaved *this)

{
  int iVar1;
  GLuint GVar2;
  GLenum GVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  TestContext *this_00;
  TestLog *log;
  undefined4 *puVar5;
  uint local_1c;
  GLuint i;
  Functions *gl;
  CaptureSpecialInterleaved *this_local;
  Functions *gl_00;
  
  pRVar4 = deqp::Context::getRenderContext(this->m_context);
  iVar1 = (*pRVar4->_vptr_RenderContext[3])();
  gl_00 = (Functions *)CONCAT44(extraout_var,iVar1);
  this_00 = deqp::Context::getTestContext(this->m_context);
  log = tcu::TestContext::getLog(this_00);
  GVar2 = Utilities::buildProgram
                    (gl_00,log,(GLchar *)0x0,(GLchar *)0x0,(GLchar *)0x0,s_vertex_shader,
                     s_fragment_shader,s_xfb_varyings,7,0x8c8c,false,(GLint *)0x0);
  this->m_program_id = GVar2;
  if (this->m_program_id == 0) {
    puVar5 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar5 = 0;
    __cxa_throw(puVar5,&int::typeinfo,0);
  }
  (*gl_00->useProgram)(this->m_program_id);
  GVar3 = (*gl_00->getError)();
  glu::checkError(GVar3,"glUseProgram call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0x1429);
  (*gl_00->genTransformFeedbacks)(1,&this->m_xfb_id);
  GVar3 = (*gl_00->getError)();
  glu::checkError(GVar3,"glGenTransformFeedbacks call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0x142d);
  (*gl_00->bindTransformFeedback)(0x8e22,this->m_xfb_id);
  GVar3 = (*gl_00->getError)();
  glu::checkError(GVar3,"glBindTransformFeedbacks call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0x1430);
  (*gl_00->genVertexArrays)(1,&this->m_vao_id);
  GVar3 = (*gl_00->getError)();
  glu::checkError(GVar3,"glGenVertexArrays call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0x1434);
  (*gl_00->bindVertexArray)(this->m_vao_id);
  GVar3 = (*gl_00->getError)();
  glu::checkError(GVar3,"glBindVertexArray call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0x1437);
  (*gl_00->genBuffers)(2,this->m_bo_id);
  GVar3 = (*gl_00->getError)();
  glu::checkError(GVar3,"glGenBuffers call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0x143b);
  for (local_1c = 0; local_1c < 2; local_1c = local_1c + 1) {
    (*gl_00->bindBuffer)(0x8c8e,this->m_bo_id[local_1c]);
    GVar3 = (*gl_00->getError)();
    glu::checkError(GVar3,"glBindBuffer call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                    ,0x1440);
    (*gl_00->bufferData)(0x8c8e,0x30,(void *)0x0,0x88ea);
    GVar3 = (*gl_00->getError)();
    glu::checkError(GVar3,"glBufferData call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                    ,0x1443);
    (*gl_00->bindBufferBase)(0x8c8e,local_1c,this->m_bo_id[local_1c]);
    GVar3 = (*gl_00->getError)();
    glu::checkError(GVar3,"glBindBufferRange call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                    ,0x1446);
  }
  return;
}

Assistant:

void gl3cts::TransformFeedback::CaptureSpecialInterleaved::prepareAndBind()
{
	/* Functions handler */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Prepare programs. */
	m_program_id = gl3cts::TransformFeedback::Utilities::buildProgram(
		gl, m_context.getTestContext().getLog(), NULL, NULL, NULL, s_vertex_shader, s_fragment_shader, s_xfb_varyings,
		s_xfb_varyings_count, GL_INTERLEAVED_ATTRIBS);

	if (0 == m_program_id)
	{
		throw 0;
	}

	gl.useProgram(m_program_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram call failed.");

	/* Prepare transform feedbacks. */
	gl.genTransformFeedbacks(1, &m_xfb_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTransformFeedbacks call failed.");

	gl.bindTransformFeedback(GL_TRANSFORM_FEEDBACK, m_xfb_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTransformFeedbacks call failed.");

	/* Create empty Vertex Array Object */
	gl.genVertexArrays(1, &m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenVertexArrays call failed.");

	gl.bindVertexArray(m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindVertexArray call failed.");

	/* Prepare buffer objects. */
	gl.genBuffers(s_bo_ids_count, m_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers call failed.");

	for (glw::GLuint i = 0; i < s_bo_ids_count; ++i)
	{
		gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, m_bo_id[i]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer call failed.");

		gl.bufferData(GL_TRANSFORM_FEEDBACK_BUFFER, s_bo_size, NULL, GL_DYNAMIC_COPY); /* allocation */
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData call failed.");

		gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, i, m_bo_id[i]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBufferRange call failed.");
	}
}